

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.cpp
# Opt level: O1

int ReadHashTable(int depth,int alpha,int beta,Movement *move)

{
  UINT8 *pUVar1;
  int iVar2;
  UINT64 UVar3;
  undefined8 uVar4;
  HashNode *pHVar5;
  UINT64 UVar6;
  uint uVar7;
  int iVar8;
  long lVar9;
  int unaff_EBP;
  int iVar10;
  int iVar11;
  
  UVar6 = ZobristKeyCheck;
  pHVar5 = HashTable;
  uVar7 = ((uint)ZobristKey & 0xffffff) << 5;
  lVar9 = 0;
  do {
    UVar3 = *(UINT64 *)((long)&pHVar5->check + lVar9 + (ulong)uVar7);
    if (UVar6 == UVar3) {
      if (*(int *)((long)&pHVar5->depth + lVar9 + (ulong)uVar7) <= depth) goto LAB_00105055;
      iVar10 = *(int *)((long)&pHVar5->value + lVar9 + (ulong)uVar7);
      iVar11 = 0;
      if (0x26f8 < iVar10) {
        iVar11 = step;
      }
      iVar10 = iVar10 - iVar11;
      iVar8 = step;
      if (-0x26f9 < iVar10) {
        iVar8 = 0;
      }
      iVar2 = *(int *)((long)&pHVar5->type + lVar9 + (ulong)uVar7);
      iVar8 = iVar8 + iVar10;
      iVar11 = 1;
      iVar10 = iVar8;
      if (iVar2 != 0) {
        if (iVar2 == 2) {
          iVar10 = beta;
          if (iVar8 < beta) goto LAB_00105055;
        }
        else if ((iVar2 != 1) || (iVar10 = alpha, alpha < iVar8)) {
LAB_00105055:
          pUVar1 = &(pHVar5->good_move).from + lVar9 + (ulong)uVar7;
          uVar4 = *(undefined8 *)pUVar1;
          *(undefined4 *)&move->catc = *(undefined4 *)(pUVar1 + 8);
          *(undefined8 *)move = uVar4;
          iVar11 = 2;
          iVar10 = unaff_EBP;
        }
      }
    }
    else {
      iVar11 = 0;
      iVar10 = unaff_EBP;
    }
    if (UVar6 == UVar3) goto LAB_00105093;
    lVar9 = lVar9 + 0x20;
    unaff_EBP = iVar10;
  } while (lVar9 == 0x20);
  iVar11 = 2;
LAB_00105093:
  if (iVar11 == 2) {
    iVar10 = 0x100000;
  }
  return iVar10;
}

Assistant:

int ReadHashTable(int depth, int alpha, int beta, Movement& move){
    int index = ZobristKey & HASHTABLE_MASK;

    for(int i = 0; i < 2; i++){
        HashNode hash_node = HashTable[index + i];
        // 判断校验值是否正确
        if(ZobristKeyCheck == hash_node.check){
            // 获取到的置换表结点的搜索深度应该较大才能认为是有效的
            if(hash_node.depth > depth){
                // 调整至相对值
                if(hash_node.value > WIN_VALUE){
                    hash_node.value -= step;
                }
                if(hash_node.value < -WIN_VALUE){
                    hash_node.value += step;
                }

                // PV结点 直接返回置换表中的值
                if(hash_node.type == hashEXACT){
                    return hash_node.value;
                }
                // alpha结点
                else if(hash_node.type == hashALPHA && hash_node.value <= alpha){
                    return alpha;
                }
                // beta结点
                else if(hash_node.type == hashBETA && hash_node.value >= beta){
                    return beta;
                }
            }
            // 读取失败就获得该局面的最佳走法
            move = hash_node.good_move;
            break;
        }
    }
    return NONE_VALUE;
}